

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_reader.h
# Opt level: O0

void MyGame_Example_Monster_sort(MyGame_Example_Monster_mutable_table_t t)

{
  MyGame_Example_Monster_vec_t vec;
  size_t sVar1;
  MyGame_Example_Monster_table_t pMVar2;
  MyGame_Example_Any_union_t MVar3;
  MyGame_Example_Any_mutable_union_t MVar4;
  MyGame_Example_Any_union_t u__tmp;
  MyGame_Example_Any_mutable_union_t u;
  size_t n__tmp;
  size_t i__tmp;
  MyGame_Example_Monster_vec_t v__tmp;
  MyGame_Example_Monster_mutable_table_t t_local;
  
  if (t != (MyGame_Example_Monster_mutable_table_t)0x0) {
    MVar3 = MyGame_Example_Monster_test_union(t);
    u__tmp._1_7_ = 0;
    u__tmp.type = MVar3.type;
    u__tmp.value = MVar3.value;
    MVar4 = MyGame_Example_Any_mutable_union_cast(u__tmp);
    u._1_7_ = 0;
    u.type = MVar4.type;
    u.value = MVar4.value;
    MyGame_Example_Any_sort(u);
    vec = MyGame_Example_Monster_testarrayoftables_get(t);
    sVar1 = MyGame_Example_Monster_vec_len(vec);
    for (n__tmp = 0; n__tmp < sVar1; n__tmp = n__tmp + 1) {
      pMVar2 = MyGame_Example_Monster_vec_at(vec,n__tmp);
      MyGame_Example_Monster_sort(pMVar2);
    }
    pMVar2 = MyGame_Example_Monster_enemy_get(t);
    MyGame_Example_Monster_sort(pMVar2);
  }
  return;
}

Assistant:

static void MyGame_Example_Monster_sort(MyGame_Example_Monster_mutable_table_t t)
{
    if (!t) return;
    __flatbuffers_sort_union_field(MyGame_Example_Monster, test, MyGame_Example_Any, t);
    __flatbuffers_sort_table_vector_field_elements(MyGame_Example_Monster, testarrayoftables, MyGame_Example_Monster, t);
    __flatbuffers_sort_table_field(MyGame_Example_Monster, enemy, MyGame_Example_Monster, t);
}